

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LlvmModule * CompileLlvm(ExpressionContext *exprCtx,ExprModule *expression)

{
  SmallArray<LLVMValueRefOpaque_*,_128U> *this;
  FunctionData *pFVar1;
  LLVMValueRefOpaque *pLVar2;
  VariableData *pVVar3;
  ExprBase *pEVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  TypeBase **ppTVar8;
  FunctionData **ppFVar9;
  LLVMValueRefOpaque **ppLVar10;
  VariableData **ppVVar11;
  ScopeData *pSVar12;
  ExprBase **ppEVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IntrusiveList<ExprBase> *pIVar15;
  uint i;
  uint uVar16;
  ArrayView<TypeBase_*> argumentTypes;
  ArrayView<TypeBase_*> argumentTypes_00;
  ArrayView<TypeBase_*> argumentTypes_01;
  ArrayView<TypeBase_*> argumentTypes_02;
  ArrayView<TypeBase_*> argumentTypes_03;
  ArrayView<TypeBase_*> argumentTypes_04;
  ArrayView<TypeBase_*> argumentTypes_05;
  ArrayView<TypeBase_*> argumentTypes_06;
  TypeBase *arguments [2];
  TraceScope traceScope;
  LlvmCompilationContext local_1380;
  LlvmModule *pLVar14;
  
  if (CompileLlvm(ExpressionContext&,ExprModule*)::token == '\0') {
    iVar7 = __cxa_guard_acquire(&CompileLlvm(ExpressionContext&,ExprModule*)::token);
    if (iVar7 != 0) {
      CompileLlvm::token = NULLC::TraceGetToken("InstructionTreeLlvm","CompileLlvm");
      __cxa_guard_release(&CompileLlvm(ExpressionContext&,ExprModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,CompileLlvm::token);
  LlvmCompilationContext::LlvmCompilationContext(&local_1380,exprCtx);
  local_1380.builder = (LLVMBuilderRef)0x0;
  local_1380.functionPassManager = (LLVMPassManagerRef)0x0;
  local_1380.context = (LLVMContextRef)0x0;
  local_1380.module = (LLVMModuleRef)0x0;
  uVar16 = 0;
  while( true ) {
    uVar6 = ((local_1380.ctx)->types).count;
    if (uVar6 <= uVar16) break;
    ppTVar8 = SmallArray<TypeBase_*,_128U>::operator[](&(local_1380.ctx)->types,uVar16);
    (*ppTVar8)->typeIndex = uVar16;
    uVar16 = uVar16 + 1;
  }
  SmallArray<LLVMTypeRefOpaque_*,_128U>::resize(&local_1380.types,uVar6);
  this = &local_1380.functions;
  memset(local_1380.types.data,0,(ulong)local_1380.types.count << 3);
  SmallArray<LLVMValueRefOpaque_*,_128U>::resize(this,((local_1380.ctx)->functions).count);
  memset(local_1380.functions.data,0,(ulong)local_1380.functions.count << 3);
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,(ArrayView<TypeBase_*>)ZEXT816(0));
  arguments[0] = &(local_1380.ctx)->typeAutoRef->super_TypeBase;
  arguments[1] = (local_1380.ctx)->typeTypeID;
  argumentTypes._8_8_ = 2;
  argumentTypes.data = arguments;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeNullPtr,argumentTypes);
  arguments[0] = (local_1380.ctx)->typeInt;
  argumentTypes_00._8_8_ = 2;
  argumentTypes_00.data = arguments;
  arguments[1] = arguments[0];
  CompileLlvmFunctionType(&local_1380,arguments[0],argumentTypes_00);
  arguments[0] = (local_1380.ctx)->typeLong;
  argumentTypes_01._8_8_ = 2;
  argumentTypes_01.data = arguments;
  arguments[1] = arguments[0];
  CompileLlvmFunctionType(&local_1380,arguments[0],argumentTypes_01);
  arguments[0] = (local_1380.ctx)->typeDouble;
  argumentTypes_02._8_8_ = 2;
  argumentTypes_02.data = arguments;
  arguments[1] = arguments[0];
  CompileLlvmFunctionType(&local_1380,arguments[0],argumentTypes_02);
  arguments[0] = (local_1380.ctx)->typeInt;
  argumentTypes_03._8_8_ = 1;
  argumentTypes_03.data = arguments;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_03);
  arguments[0] = (local_1380.ctx)->typeLong;
  argumentTypes_04._8_8_ = 1;
  argumentTypes_04.data = arguments;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_04);
  arguments[0] = (local_1380.ctx)->typeDouble;
  argumentTypes_05._8_8_ = 1;
  argumentTypes_05.data = arguments;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_05);
  arguments[0] = (local_1380.ctx)->typeInt;
  arguments[1] = (local_1380.ctx)->typeNullPtr;
  argumentTypes_06._8_8_ = 3;
  argumentTypes_06.data = arguments;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_06);
  uVar16 = 0;
  while( true ) {
    uVar6 = ((local_1380.ctx)->functions).count;
    if (uVar6 <= uVar16) break;
    ppFVar9 = SmallArray<FunctionData_*,_128U>::operator[](&(local_1380.ctx)->functions,uVar16);
    pFVar1 = *ppFVar9;
    bVar5 = ExpressionContext::IsGenericFunction(local_1380.ctx,pFVar1);
    if ((!bVar5) &&
       ((pFVar1->isPrototype != true || (pFVar1->implementation == (FunctionData *)0x0)))) {
      ppLVar10 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[](this,pFVar1->functionIndex);
      if (*ppLVar10 == (LLVMValueRefOpaque *)0x0) {
        CreateLlvmFunctionName(&local_1380,pFVar1);
        CompileLlvmFunctionType(&local_1380,pFVar1->type);
        ppLVar10 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[](this,pFVar1->functionIndex);
        *ppLVar10 = (LLVMValueRefOpaque *)&placeholderValue;
        if ((pFVar1->importModule == (ModuleData *)0x0) && (pFVar1->isPrototype == true)) {
          CompileLlvmExternalFunctionWrapper(&local_1380,pFVar1);
        }
      }
    }
    uVar16 = uVar16 + 1;
  }
  for (uVar16 = 0; uVar16 < uVar6; uVar16 = uVar16 + 1) {
    ppFVar9 = SmallArray<FunctionData_*,_128U>::operator[](&(local_1380.ctx)->functions,uVar16);
    pFVar1 = *ppFVar9;
    if ((pFVar1->isPrototype == true) && (pFVar1->implementation != (FunctionData *)0x0)) {
      ppLVar10 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                           (this,pFVar1->implementation->functionIndex);
      pLVar2 = *ppLVar10;
      ppLVar10 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[](this,pFVar1->functionIndex);
      *ppLVar10 = pLVar2;
    }
    uVar6 = ((local_1380.ctx)->functions).count;
  }
  uVar16 = 0;
  do {
    if (((local_1380.ctx)->variables).count <= uVar16) {
      for (uVar16 = 0; uVar16 < (expression->definitions).count; uVar16 = uVar16 + 1) {
        ppEVar13 = SmallArray<ExprBase_*,_32U>::operator[](&expression->definitions,uVar16);
        CompileLlvm(&local_1380,*ppEVar13);
      }
      local_1380.skipFunctionDefinitions = true;
      local_1380.currentFunction = (LLVMValueRef)&placeholderValue;
      local_1380.currentFunctionGlobal = true;
      pIVar15 = &expression->setup;
      while (pEVar4 = pIVar15->head, pEVar4 != (ExprBase *)0x0) {
        CompileLlvm(&local_1380,pEVar4);
        pIVar15 = (IntrusiveList<ExprBase> *)&pEVar4->next;
      }
      pIVar15 = &expression->expressions;
      while (pEVar4 = pIVar15->head, pEVar4 != (ExprBase *)0x0) {
        CompileLlvm(&local_1380,pEVar4);
        pIVar15 = (IntrusiveList<ExprBase> *)&pEVar4->next;
      }
      local_1380.currentFunction = (LLVMValueRef)0x0;
      local_1380.currentFunctionGlobal = false;
      iVar7 = (*(local_1380.allocator)->_vptr_Allocator[2])(local_1380.allocator,0x10);
      pLVar14 = (LlvmModule *)CONCAT44(extraout_var,iVar7);
      pLVar14->moduleData = (char *)0x0;
      pLVar14->moduleSize = 0;
      iVar7 = (*(local_1380.allocator)->_vptr_Allocator[2])(local_1380.allocator,0);
      pLVar14->moduleData = (char *)CONCAT44(extraout_var_00,iVar7);
      LlvmCompilationContext::~LlvmCompilationContext(&local_1380);
      NULLC::TraceScope::~TraceScope(&traceScope);
      return pLVar14;
    }
    ppVVar11 = SmallArray<VariableData_*,_128U>::operator[](&(local_1380.ctx)->variables,uVar16);
    pVVar3 = *ppVVar11;
    pSVar12 = ExpressionContext::GlobalScopeFrom(local_1380.ctx,pVVar3->scope);
    if (pSVar12 != (ScopeData *)0x0) {
      CompileLlvmType(&local_1380,pVVar3->type);
      CreateLlvmName(&local_1380,pVVar3->name->name);
      arguments[0] = (TypeBase *)&placeholderValue;
      if (pVVar3->importModule == (ModuleData *)0x0) {
        CompileLlvmType(&local_1380,pVVar3->type);
      }
      ppLVar10 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                 ::find(&local_1380.variables,&pVVar3->uniqueId);
      if (ppLVar10 != (LLVMValueRefOpaque **)0x0) {
        __assert_fail("!ctx.variables.find(variable->uniqueId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0xa25,"LlvmModule *CompileLlvm(ExpressionContext &, ExprModule *)");
      }
      SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                (&local_1380.variables,&pVVar3->uniqueId,(LLVMValueRefOpaque **)arguments);
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

LlvmModule* CompileLlvm(ExpressionContext &exprCtx, ExprModule *expression)
{
	TRACE_SCOPE("InstructionTreeLlvm", "CompileLlvm");

	LlvmCompilationContext ctx(exprCtx);

	ctx.context = LLVMContextCreate();

	ctx.module = LLVMModuleCreateWithNameInContext("module", ctx.context);

	ctx.builder = LLVMCreateBuilderInContext(ctx.context);

	ctx.functionPassManager = LLVMCreateFunctionPassManagerForModule(ctx.module);

	LLVMAddBasicAliasAnalysisPass(ctx.functionPassManager);

	if(ctx.enableOptimization)
	{
		LLVMAddScalarReplAggregatesPass(ctx.functionPassManager);
		LLVMAddInstructionCombiningPass(ctx.functionPassManager);
		LLVMAddEarlyCSEPass(ctx.functionPassManager);
		LLVMAddReassociatePass(ctx.functionPassManager);
		LLVMAddGVNPass(ctx.functionPassManager);
		LLVMAddConstantPropagationPass(ctx.functionPassManager);
	}

	LLVMAddCFGSimplificationPass(ctx.functionPassManager);
	LLVMAddAggressiveDCEPass(ctx.functionPassManager);

	LLVMInitializeFunctionPassManager(ctx.functionPassManager);

	// Generate type indexes
	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
		ctx.ctx.types[i]->typeIndex = i;

	// Reserve types, generate as required
	ctx.types.resize(ctx.ctx.types.size());
	memset(ctx.types.data, 0, ctx.types.count * sizeof(ctx.types[0]));

	// Reserve functions
	ctx.functions.resize(ctx.ctx.functions.size());
	memset(ctx.functions.data, 0, ctx.functions.count * sizeof(ctx.functions[0]));

	// Create runtime support functions
	{
		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmAbortNoReturn", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, ArrayView<TypeBase*>()));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeAutoRef, ctx.ctx.typeTypeID };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmConvertPtr", CompileLlvmFunctionType(ctx, ctx.ctx.typeNullPtr, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt, ctx.ctx.typeInt };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowInt", CompileLlvmFunctionType(ctx, ctx.ctx.typeInt, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeLong, ctx.ctx.typeLong };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowLong", CompileLlvmFunctionType(ctx, ctx.ctx.typeLong, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeDouble, ctx.ctx.typeDouble };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowDouble", CompileLlvmFunctionType(ctx, ctx.ctx.typeDouble, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnInt", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeLong };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnLong", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeDouble };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnDouble", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt, ctx.ctx.typeNullPtr, ctx.ctx.typeNullPtr };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmExternalCall", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	// Generate functions
	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
			continue;

		// Skip prototypes that will have an implementation later
		if(function->isPrototype && function->implementation)
			continue;

		// Skip if function is already ready
		if(ctx.functions[function->functionIndex])
			continue;

		LLVMValueRef llvmFunction = LLVMAddFunction(ctx.module, CreateLlvmFunctionName(ctx, function), CompileLlvmFunctionType(ctx, function->type));

		if(IsStructReturnType(function->type->returnType))
		{
			LLVMAddAttributeAtIndex(llvmFunction, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("nonnull", unsigned(strlen("nonnull"))), 0));
			LLVMAddAttributeAtIndex(llvmFunction, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("sret", unsigned(strlen("sret"))), 0));
		}

		ctx.functions[function->functionIndex] = llvmFunction;

		// Create an external function call wrapper
		if(function->importModule == NULL && function->isPrototype)
			CompileLlvmExternalFunctionWrapper(ctx, function);
	}

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(function->isPrototype && function->implementation)
			ctx.functions[function->functionIndex] = ctx.functions[function->implementation->functionIndex];
	}

	// Generate global variables
	for(unsigned i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		if(ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			LLVMValueRef value = LLVMAddGlobal(ctx.module, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

			if(!variable->importModule)
				LLVMSetInitializer(value, LLVMConstNull(CompileLlvmType(ctx, variable->type)));

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, value);
		}
	}

	for(unsigned i = 0; i < expression->definitions.size(); i++)
		CompileLlvm(ctx, expression->definitions[i]);

	ctx.skipFunctionDefinitions = true;

	// Generate global function
	{
		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmEntry", LLVMFunctionType(LLVMVoidTypeInContext(ctx.context), NULL, 0, false));

		LLVMSetLinkage(function, LLVMExternalLinkage);

		// Setup global function
		ctx.currentFunction = function;
		ctx.currentFunctionGlobal = true;

		LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

		LLVMPositionBuilderAtEnd(ctx.builder, block);

		for(ExprBase *value = expression->setup.head; value; value = value->next)
			CompileLlvm(ctx, value);

		for(ExprBase *value = expression->expressions.head; value; value = value->next)
			CompileLlvm(ctx, value);

		LLVMBuildRetVoid(ctx.builder);

		CheckFunction(ctx, ctx.currentFunction, InplaceStr("global"));

		if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
			LLVMRunFunctionPassManager(ctx.functionPassManager, function);

		ctx.currentFunction = NULL;
		ctx.currentFunctionGlobal = false;
	}

	LLVMFinalizeFunctionPassManager(ctx.functionPassManager);

	char *error = NULL;

	if(LLVMVerifyModule(ctx.module, LLVMReturnStatusAction, &error))
	{
		printf("LLVM module verification failed with:\n%s\n", error);

		LLVMDisposeMessage(error);

		LLVMDisposePassManager(ctx.functionPassManager);

		LLVMDisposeBuilder(ctx.builder);

		LLVMDisposeModule(ctx.module);

		LLVMContextDispose(ctx.context);

		return NULL;
	}

	LLVMDisposeMessage(error);

	LlvmModule *module = new (ctx.get<LlvmModule>()) LlvmModule();

	LLVMMemoryBufferRef buffer = LLVMWriteBitcodeToMemoryBuffer(ctx.module);

	module->moduleSize = (unsigned)LLVMGetBufferSize(buffer);

	module->moduleData = (char*)ctx.allocator->alloc(module->moduleSize);

	if(const char *start = LLVMGetBufferStart(buffer))
		memcpy(module->moduleData, start, module->moduleSize);

	LLVMDisposeMemoryBuffer(buffer);

	LLVMDisposePassManager(ctx.functionPassManager);

	LLVMDisposeBuilder(ctx.builder);

	LLVMDisposeModule(ctx.module);

	LLVMContextDispose(ctx.context);

	return module;
}